

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_advanced.c
# Opt level: O1

int light_section_feature_extraction
              (light_pcapng section,_func_int_light_pcapng_void_ptr_size_t *extractor,
              void **feature_vector,size_t feature_vector_size,light_feature_t type)

{
  light_boolean lVar1;
  void *pvVar2;
  int iVar3;
  size_t __size;
  size_t sVar4;
  _light_pcapng *section_00;
  
  lVar1 = __is_section_header(section);
  if (lVar1 != LIGHT_TRUE) {
    return -1;
  }
  sVar4 = feature_vector_size;
  switch(type) {
  case LIGHT_FEATURE_BITMASK:
    __size = 8;
    sVar4 = 1;
    break;
  case LIGHT_FEATURE_BYTE:
    __size = 1;
    break;
  case LIGHT_FEATURE_SHORT:
    __size = 2;
    break;
  default:
    goto switchD_001037d8_caseD_3;
  case LIGHT_FEATURE_FLOAT:
    __size = 4;
    break;
  case LIGHT_FEATURE_DOUBLE:
    __size = 8;
  }
  pvVar2 = calloc(sVar4,__size);
  *feature_vector = pvVar2;
switchD_001037d8_caseD_3:
  if (*feature_vector == (void *)0x0) {
    iVar3 = -2;
  }
  else {
    (*extractor)(section,*feature_vector,feature_vector_size);
    section_00 = section->next_block;
    while ((iVar3 = 0, section_00 != (_light_pcapng *)0x0 &&
           (lVar1 = __is_section_header(section_00), iVar3 = 0, lVar1 != LIGHT_TRUE))) {
      (*extractor)(section_00,*feature_vector,feature_vector_size);
      section_00 = section_00->next_block;
    }
  }
  return iVar3;
}

Assistant:

int light_section_feature_extraction(const light_pcapng section, int (*extractor)(const light_pcapng, void *, size_t),
		void **feature_vector, const size_t feature_vector_size, const light_feature_t type)
{
	light_pcapng iterator;

	if (__is_section_header(section) != LIGHT_TRUE) {
		return LIGHT_INVALID_SECTION;
	}

	switch(type) {
	case LIGHT_FEATURE_BITMASK:
		*feature_vector = calloc(1, sizeof(uint64_t));
		break;
	case LIGHT_FEATURE_BYTE:
		*feature_vector = calloc(feature_vector_size, sizeof(uint8_t));
		break;
	case LIGHT_FEATURE_SHORT:
		*feature_vector = calloc(feature_vector_size, sizeof(uint16_t));
		break;
	case LIGHT_FEATURE_FLOAT:
		*feature_vector = calloc(feature_vector_size, sizeof(float));
		break;
	case LIGHT_FEATURE_DOUBLE:
		*feature_vector = calloc(feature_vector_size, sizeof(double));
		break;
	}

	if (*feature_vector == NULL) {
		return LIGHT_OUT_OF_MEMORY;
	}

	extractor(section, *feature_vector, feature_vector_size);
	iterator = section->next_block;
	while (iterator != NULL && __is_section_header(iterator) != LIGHT_TRUE) {
		extractor(iterator, *feature_vector, feature_vector_size);
		iterator = iterator->next_block;
	}

	return LIGHT_SUCCESS;
}